

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::PizCompressor::compress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  uint uVar2;
  uint b_00;
  size_t __n;
  short sVar3;
  int i;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  ConstIterator CVar10;
  byte *pbVar11;
  void *__s;
  short sVar12;
  unsigned_short *puVar13;
  char *compressed;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  PizCompressor *pPVar18;
  long lVar19;
  int i_1;
  uint uVar20;
  long lVar21;
  ChannelData *pCVar22;
  bool bVar23;
  uchar b [2];
  ulong local_70;
  unsigned_short local_5a;
  byte *local_58;
  PizCompressor *local_50;
  unsigned_short *local_48;
  char local_40 [4];
  int local_3c;
  char **local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    iVar4 = 0;
  }
  else {
    local_58 = (byte *)CONCAT44(local_58._4_4_,(range->min).x);
    uVar20 = (range->min).y;
    iVar4 = (range->max).x;
    uVar2 = (range->max).y;
    b_00 = this->_maxY;
    if ((int)uVar2 < this->_maxY) {
      b_00 = uVar2;
    }
    iVar5 = this->_maxX;
    if (iVar4 < this->_maxX) {
      iVar5 = iVar4;
    }
    local_48 = (unsigned_short *)CONCAT44(local_48._4_4_,iVar5);
    puVar13 = this->_tmpBuffer;
    local_38 = outPtr;
    cVar8._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    cVar9._M_node = (_Base_ptr)ChannelList::end(this->_channels);
    local_50 = this;
    if (cVar8._M_node != cVar9._M_node) {
      lVar21 = 0x1c;
      do {
        pCVar22 = local_50->_channelData;
        *(unsigned_short **)((long)pCVar22 + lVar21 + -0x1c) = puVar13;
        *(unsigned_short **)((long)pCVar22 + lVar21 + -0x14) = puVar13;
        iVar4 = numSamples(*(int *)&cVar8._M_node[9].field_0x4,(int)local_58,(int)local_48);
        *(int *)((long)pCVar22 + lVar21 + -0xc) = iVar4;
        iVar4 = numSamples(*(int *)&cVar8._M_node[9]._M_parent,uVar20,b_00);
        *(int *)((long)pCVar22 + lVar21 + -8) = iVar4;
        *(undefined4 *)((long)pCVar22 + lVar21 + -4) = *(undefined4 *)&cVar8._M_node[9]._M_parent;
        iVar4 = pixelTypeSize(cVar8._M_node[9]._M_color);
        iVar5 = pixelTypeSize(HALF);
        *(int *)((long)&pCVar22->start + lVar21) = iVar4 / iVar5;
        puVar13 = puVar13 + (iVar4 / iVar5) * *(int *)((long)pCVar22 + lVar21 + -0xc) *
                            *(int *)((long)pCVar22 + lVar21 + -8);
        cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
        CVar10 = ChannelList::end(local_50->_channels);
        lVar21 = lVar21 + 0x20;
      } while ((const_iterator)cVar8._M_node != CVar10._i._M_node);
    }
    pPVar18 = local_50;
    local_48 = puVar13;
    if (local_50->_format == XDR) {
      if ((int)uVar20 <= (int)b_00) {
        uVar2 = local_50->_numChans;
        pCVar22 = local_50->_channelData;
        do {
          if (0 < (int)uVar2) {
            uVar16 = 0;
            do {
              uVar7 = pCVar22[uVar16].ys;
              if ((int)uVar20 < 0) {
                if (-1 < (int)uVar7) {
                  uVar6 = (uVar7 + ~uVar20) / uVar7;
                  goto LAB_004084ea;
                }
                uVar6 = (~uVar7 - uVar20) / -uVar7;
              }
              else if ((int)uVar7 < 0) {
                uVar6 = uVar20 / -uVar7;
LAB_004084ea:
                uVar6 = -uVar6;
              }
              else {
                uVar6 = uVar20 / uVar7;
              }
              if (uVar20 == uVar6 * uVar7) {
                iVar4 = pCVar22[uVar16].size * pCVar22[uVar16].nx;
                if (0 < iVar4) {
                  puVar13 = pCVar22[uVar16].end;
                  do {
                    pcVar15 = inPtr;
                    lVar21 = 0;
                    do {
                      *(char *)((long)&local_5a + lVar21) = pcVar15[lVar21];
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 != 2);
                    *puVar13 = local_5a;
                    puVar13 = puVar13 + 1;
                    pCVar22[uVar16].end = puVar13;
                    bVar23 = 1 < iVar4;
                    inPtr = pcVar15 + lVar21;
                    iVar4 = iVar4 + -1;
                  } while (bVar23);
                  inPtr = pcVar15 + lVar21;
                }
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar2);
          }
          bVar23 = uVar20 != b_00;
          uVar20 = uVar20 + 1;
        } while (bVar23);
      }
    }
    else if ((int)uVar20 <= (int)b_00) {
      do {
        if (0 < pPVar18->_numChans) {
          local_58 = (byte *)(ulong)~uVar20;
          lVar17 = 8;
          lVar21 = 0;
          do {
            pCVar22 = pPVar18->_channelData;
            uVar2 = *(uint *)((long)&pCVar22->nx + lVar17);
            if ((int)uVar20 < 0) {
              if (-1 < (int)uVar2) {
                uVar7 = ((int)local_58 + uVar2) / uVar2;
                goto LAB_004085f3;
              }
              uVar7 = (~uVar2 - uVar20) / -uVar2;
            }
            else if ((int)uVar2 < 0) {
              uVar7 = uVar20 / -uVar2;
LAB_004085f3:
              uVar7 = -uVar7;
            }
            else {
              uVar7 = uVar20 / uVar2;
            }
            if (uVar20 == uVar7 * uVar2) {
              lVar19 = (long)*(int *)((long)&pCVar22->ny + lVar17) *
                       (long)*(int *)((long)&pCVar22->end + lVar17);
              __n = lVar19 * 2;
              memcpy(*(void **)((long)&pCVar22->start + lVar17),inPtr,__n);
              inPtr = inPtr + lVar19 * 2;
              plVar1 = (long *)((long)&pCVar22->start + lVar17);
              *plVar1 = *plVar1 + __n;
              pPVar18 = local_50;
            }
            lVar21 = lVar21 + 1;
            lVar17 = lVar17 + 0x20;
          } while (lVar21 < pPVar18->_numChans);
        }
        bVar23 = uVar20 != b_00;
        uVar20 = uVar20 + 1;
      } while (bVar23);
    }
    pbVar11 = (byte *)operator_new__(0x2000);
    memset(pbVar11,0,0x2000);
    puVar13 = pPVar18->_tmpBuffer;
    uVar16 = (long)local_48 - (long)puVar13;
    memset(pbVar11,0,0x2000);
    uVar20 = (uint)(uVar16 >> 1);
    if (0 < (int)uVar20) {
      uVar16 = 0;
      do {
        pbVar11[puVar13[uVar16] >> 3] =
             pbVar11[puVar13[uVar16] >> 3] | (byte)(1 << ((byte)puVar13[uVar16] & 7));
        uVar16 = uVar16 + 1;
      } while ((uVar20 & 0x7fffffff) != uVar16);
    }
    *pbVar11 = *pbVar11 & 0xfe;
    uVar14 = 0x1fff;
    local_70 = 0;
    uVar16 = 0;
    do {
      if (pbVar11[uVar16] != 0) {
        uVar14 = uVar14 & 0xffff;
        if (uVar16 < uVar14) {
          uVar14 = uVar16 & 0xffffffff;
        }
        local_70 = local_70 & 0xffff;
        if (local_70 < uVar16) {
          local_70 = uVar16 & 0xffffffff;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x2000);
    __s = operator_new__(0x20000);
    uVar16 = 0;
    memset(__s,0,0x20000);
    sVar3 = 0;
    do {
      if ((uVar16 == 0) || ((pbVar11[uVar16 >> 3 & 0x1fffffff] >> ((uint)uVar16 & 7) & 1) != 0)) {
        sVar12 = sVar3;
        sVar3 = sVar3 + 1;
      }
      else {
        sVar12 = 0;
      }
      *(short *)((long)__s + uVar16 * 2) = sVar12;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x10000);
    if (0 < (int)uVar20) {
      uVar16 = 0;
      do {
        puVar13[uVar16] = *(unsigned_short *)((long)__s + (ulong)puVar13[uVar16] * 2);
        uVar16 = uVar16 + 1;
      } while ((uVar20 & 0x7fffffff) != uVar16);
    }
    pcVar15 = pPVar18->_outBuffer;
    *pcVar15 = (char)uVar14;
    pcVar15[1] = (char)(uVar14 >> 8);
    pcVar15[2] = (char)local_70;
    pcVar15[3] = (char)(local_70 >> 8);
    pcVar15 = pcVar15 + 4;
    if ((ushort)uVar14 <= (ushort)local_70) {
      iVar4 = ((uint)local_70 & 0xffff) - (int)(uVar14 & 0xffff);
      if (iVar4 != -1) {
        lVar21 = 0;
        do {
          pcVar15[lVar21] = pbVar11[lVar21 + (uVar14 & 0xffff)];
          lVar21 = lVar21 + 1;
        } while (iVar4 + 1 != (int)lVar21);
        pcVar15 = pcVar15 + lVar21;
      }
    }
    local_58 = pbVar11;
    if (0 < pPVar18->_numChans) {
      lVar21 = 0;
      do {
        uVar20 = pPVar18->_channelData[lVar21].size;
        uVar16 = (ulong)uVar20;
        if (0 < (int)uVar20) {
          pCVar22 = pPVar18->_channelData + lVar21;
          lVar17 = 0;
          lVar19 = 0;
          do {
            wav2Encode((unsigned_short *)((long)pCVar22->start + lVar17),pCVar22->nx,(int)uVar16,
                       pCVar22->ny,pCVar22->nx * (int)uVar16,sVar3 - 1);
            lVar19 = lVar19 + 1;
            uVar16 = (ulong)pCVar22->size;
            lVar17 = lVar17 + 2;
          } while (lVar19 < (long)uVar16);
        }
        lVar21 = lVar21 + 1;
        pPVar18 = local_50;
      } while (lVar21 < local_50->_numChans);
    }
    pbVar11 = local_58;
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    iVar4 = -(int)pcVar15;
    lVar21 = 0;
    compressed = pcVar15;
    do {
      *compressed = local_40[lVar21];
      compressed = compressed + 1;
      iVar4 = iVar4 + -1;
      lVar21 = lVar21 + 1;
    } while ((int)lVar21 != 4);
    local_3c = hufCompress(pPVar18->_tmpBuffer,
                           (int)((ulong)((long)local_48 - (long)pPVar18->_tmpBuffer) >> 1),
                           compressed);
    lVar21 = 0;
    do {
      pcVar15[lVar21] = *(char *)((long)&local_3c + lVar21);
      lVar21 = lVar21 + 1;
    } while ((int)lVar21 != 4);
    *local_38 = pPVar18->_outBuffer;
    iVar4 = (local_3c - *(int *)&pPVar18->_outBuffer) - iVar4;
    operator_delete__(__s);
    operator_delete__(pbVar11);
  }
  return iVar4;
}

Assistant:

int
PizCompressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // This is the compress function which is used by both the tiled and
    // scanline compression routines.
    //

    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Rearrange the pixel data so that the wavelet
    // and Huffman encoders can process them easily.
    //
    // The wavelet and Huffman encoders both handle only
    // 16-bit data, so 32-bit data must be split into smaller
    // pieces.  We treat each 32-bit channel (UINT, FLOAT) as
    // two interleaved 16-bit channels.
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::read <CharPtrIO> (inPtr, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // Compress the range of the pixel data
    //

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    unsigned short minNonZero;
    unsigned short maxNonZero;

    bitmapFromData (_tmpBuffer,
		    tmpBufferEnd - _tmpBuffer,
		    bitmap,
		    minNonZero, maxNonZero);

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = forwardLutFromBitmap (bitmap, lut);
    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Store range compression info in _outBuffer
    //

    char *buf = _outBuffer;

    Xdr::write <CharPtrIO> (buf, minNonZero);
    Xdr::write <CharPtrIO> (buf, maxNonZero);

    if (minNonZero <= maxNonZero)
    {
	Xdr::write <CharPtrIO> (buf, (char *) &bitmap[0] + minNonZero,
				maxNonZero - minNonZero + 1);
    }

    //
    // Apply wavelet encoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Encode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Apply Huffman encoding; append the result to _outBuffer
    //

    char *lengthPtr = buf;
    Xdr::write <CharPtrIO> (buf, int(0));

    int length = hufCompress (_tmpBuffer, tmpBufferEnd - _tmpBuffer, buf);
    Xdr::write <CharPtrIO> (lengthPtr, length);

    outPtr = _outBuffer;
    return buf - _outBuffer + length;
}